

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5Colset * fts5ParseColset(Fts5Parse *pParse,Fts5Colset *p,int iCol)

{
  Fts5Colset *pFVar1;
  int local_44;
  int local_40;
  int local_3c;
  int j;
  int i;
  int *aiCol;
  Fts5Colset *pNew;
  int nCol;
  int iCol_local;
  Fts5Colset *p_local;
  Fts5Parse *pParse_local;
  
  if (p == (Fts5Colset *)0x0) {
    local_44 = 0;
  }
  else {
    local_44 = p->nCol;
  }
  pFVar1 = (Fts5Colset *)sqlite3_realloc64(p,(long)local_44 * 4 + 8);
  if (pFVar1 == (Fts5Colset *)0x0) {
    pParse->rc = 7;
  }
  else {
    for (local_3c = 0; local_3c < local_44; local_3c = local_3c + 1) {
      if (pFVar1->aiCol[local_3c] == iCol) {
        return pFVar1;
      }
      if (iCol < pFVar1->aiCol[local_3c]) break;
    }
    for (local_40 = local_44; local_3c < local_40; local_40 = local_40 + -1) {
      pFVar1->aiCol[local_40] = pFVar1->aiCol[local_40 + -1];
    }
    pFVar1->aiCol[local_3c] = iCol;
    pFVar1->nCol = local_44 + 1;
  }
  return pFVar1;
}

Assistant:

static Fts5Colset *fts5ParseColset(
  Fts5Parse *pParse,              /* Store SQLITE_NOMEM here if required */
  Fts5Colset *p,                  /* Existing colset object */
  int iCol                        /* New column to add to colset object */
){
  int nCol = p ? p->nCol : 0;     /* Num. columns already in colset object */
  Fts5Colset *pNew;               /* New colset object to return */

  assert( pParse->rc==SQLITE_OK );
  assert( iCol>=0 && iCol<pParse->pConfig->nCol );

  pNew = sqlite3_realloc64(p, sizeof(Fts5Colset) + sizeof(int)*nCol);
  if( pNew==0 ){
    pParse->rc = SQLITE_NOMEM;
  }else{
    int *aiCol = pNew->aiCol;
    int i, j;
    for(i=0; i<nCol; i++){
      if( aiCol[i]==iCol ) return pNew;
      if( aiCol[i]>iCol ) break;
    }
    for(j=nCol; j>i; j--){
      aiCol[j] = aiCol[j-1];
    }
    aiCol[i] = iCol;
    pNew->nCol = nCol+1;

#ifndef NDEBUG
    /* Check that the array is in order and contains no duplicate entries. */
    for(i=1; i<pNew->nCol; i++) assert( pNew->aiCol[i]>pNew->aiCol[i-1] );
#endif
  }

  return pNew;
}